

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

u32 __thiscall
moira::Moira::computeEAfull<(moira::Core)2,(moira::Mode)10,4,2ull>(Moira *this,u32 an)

{
  ushort uVar1;
  int iVar2;
  u32 uVar3;
  u32 uVar4;
  uint uVar5;
  int iVar6;
  ushort uVar7;
  
  uVar1 = (this->queue).irc;
  readExt<(moira::Core)2>(this);
  uVar7 = uVar1 >> 4 & 3;
  if (uVar7 == 3) {
    uVar3 = readExt<(moira::Core)2,4>(this);
  }
  else {
    uVar3 = 0;
    if (uVar7 == 2) {
      uVar3 = readExt<(moira::Core)2,2>(this);
      uVar3 = (u32)(short)uVar3;
    }
  }
  uVar7 = uVar1 & 3;
  if (uVar7 == 3) {
    uVar4 = readExt<(moira::Core)2,4>(this);
  }
  else {
    uVar4 = 0;
    if (uVar7 == 2) {
      uVar4 = readExt<(moira::Core)2,2>(this);
      uVar4 = (u32)(short)uVar4;
    }
  }
  iVar6 = 0;
  if ((char)uVar1 < '\0') {
    an = 0;
  }
  if ((uVar1 & 0x40) == 0) {
    iVar2 = *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 0xc) * 4);
    iVar6 = (int)(short)iVar2;
    if ((uVar1 >> 0xb & 1) != 0) {
      iVar6 = iVar2;
    }
    iVar6 = iVar6 << ((byte)(uVar1 >> 9) & 3);
  }
  if ((uVar1 & 4) == 0) {
    uVar3 = uVar3 + an + iVar6;
    if (uVar7 != 0) {
      uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,4,0ull>(this,uVar3);
      uVar3 = uVar3 + uVar4;
    }
  }
  else {
    uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,4,0ull>(this,uVar3 + an);
    uVar3 = iVar6 + uVar4 + uVar3;
  }
  uVar5 = 0;
  if ((uVar1 >> 8 & 1) != 0) {
    uVar5 = (uint)(byte)(&DAT_0033f7d0)[uVar1 & 0x3f];
  }
  this->cp = this->cp + uVar5;
  return uVar3;
}

Assistant:

u32
Moira::computeEAfull(u32 an)
{
    u32 result;

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
    // -----------------------------------------------------------------------

    u16  ext   = queue.irc;
    u16  rn    = xxxx____________ (ext);
    u16  lw    = ____x___________ (ext);
    u16  scale = _____xx_________ (ext);
    u16  bs    = ________x_______ (ext);
    u16  is    = _________x______ (ext);
    u16  iis   = _____________xxx (ext);

    u32 xn = 0, bd = 0, od = 0;

    // Read extension words
    readExt<C>();
    auto dw = baseDispWords(ext);
    if (dw == 1) bd = SEXT<Word>(readExt<C, Word>());
    if (dw == 2) bd = readExt<C, Long>();
    auto ow = outerDispWords(ext);
    if (ow == 1) od = SEXT<Word>(readExt<C, Word>());
    if (ow == 2) od = readExt<C, Long>();

    // Wipe out an if base register is present
    if (bs) an = 0;

    // Check if index is present
    if (!is) xn = (lw ? readR(rn) : SEXT<Word>(readR(rn))) << scale;

    // Compute effective address
    if (iis & 0b100) {
        result = readM<C, M, Long>(an + bd) + xn + od;
    } else if (iis & 0b011) {
        result = readM<C, M, Long>(an + bd + xn) + od;
    } else {
        result = an + bd + xn;
    }

    // Add the number of extra cycles consumed in this addressing mode
    cp += penaltyCycles<C, M, S>(ext);

    return result;
}